

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O0

REF_STATUS ref_adapt_pass(REF_GRID ref_grid,REF_BOOL *all_done)

{
  uint uVar1;
  double dVar2;
  bool local_14d;
  REF_STATUS ref_private_macro_code_rss_69;
  REF_STATUS ref_private_macro_code_rss_68;
  REF_STATUS ref_private_macro_code_rss_67;
  REF_STATUS ref_private_macro_code_rss_66;
  REF_STATUS ref_private_macro_code_rss_65;
  REF_STATUS ref_private_macro_code_rss_64;
  REF_STATUS ref_private_macro_code_rss_63;
  REF_STATUS ref_private_macro_code_rss_62;
  REF_STATUS ref_private_macro_code_rss_61;
  REF_STATUS ref_private_macro_code_rss_60;
  REF_STATUS ref_private_macro_code_rss_59;
  REF_STATUS ref_private_macro_code_rss_58;
  REF_STATUS ref_private_macro_code_rss_57;
  REF_STATUS ref_private_macro_code_rss_56;
  REF_STATUS ref_private_macro_code_rss_55;
  REF_STATUS ref_private_macro_code_rss_54;
  REF_STATUS ref_private_macro_code_rss_53;
  REF_STATUS ref_private_macro_code_rss_52;
  REF_STATUS ref_private_macro_code_rss_51;
  REF_STATUS ref_private_macro_code_rss_50;
  REF_STATUS ref_private_macro_code_rss_49;
  REF_STATUS ref_private_macro_code_rss_48;
  REF_STATUS ref_private_macro_code_rss_47;
  REF_STATUS ref_private_macro_code_rss_46;
  REF_STATUS ref_private_macro_code_rss_45;
  REF_STATUS ref_private_macro_code_rss_44;
  REF_STATUS ref_private_macro_code_rss_43;
  REF_STATUS ref_private_macro_code_rss_42;
  REF_STATUS ref_private_macro_code_rss_41;
  REF_STATUS ref_private_macro_code_rss_40;
  REF_STATUS ref_private_macro_code_rss_39;
  REF_STATUS ref_private_macro_code_rss_38;
  REF_STATUS ref_private_macro_code_rss_37;
  REF_STATUS ref_private_macro_code_rss_36;
  REF_STATUS ref_private_macro_code_rss_35;
  REF_STATUS ref_private_macro_code_rss_34;
  REF_STATUS ref_private_macro_code_rss_33;
  REF_STATUS ref_private_macro_code_rss_32;
  REF_STATUS ref_private_macro_code_rss_31;
  REF_STATUS ref_private_macro_code_rss_30;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT swap_smooth_passes;
  REF_INT i;
  REF_BOOL all_done1;
  REF_BOOL all_done0;
  REF_INT ngeom;
  REF_BOOL *all_done_local;
  REF_GRID ref_grid_local;
  
  _all_done0 = (uint *)all_done;
  all_done_local = (REF_BOOL *)ref_grid;
  uVar1 = ref_adapt_parameter(ref_grid,&i);
  if (uVar1 == 0) {
    uVar1 = ref_gather_ngeom(*(REF_NODE *)(all_done_local + 2),*(REF_GEOM *)(all_done_local + 0x26),
                             2,&all_done1);
    if (uVar1 == 0) {
      if ((all_done1 < 1) || (uVar1 = ref_geom_verify_topo((REF_GRID)all_done_local), uVar1 == 0)) {
        uVar1 = ref_gather_tec_movie_frame((REF_GRID)all_done_local,"threed pass");
        if (uVar1 == 0) {
          if (1 < *(int *)(*(long *)(all_done_local + 0x2a) + 0x7c)) {
            ref_mpi_stopwatch_stop(*(REF_MPI *)all_done_local,"adapt start");
          }
          if ((*(int *)(*(long *)(all_done_local + 0x2a) + 0x80) == 0) ||
             (uVar1 = ref_adapt_tattle((REF_GRID)all_done_local,"start"), uVar1 == 0)) {
            if ((*(int *)(*(long *)(all_done_local + 0x2a) + 0x84) == 0) ||
               (uVar1 = ref_adapt_topo((REF_GRID)all_done_local), uVar1 == 0)) {
              uVar1 = ref_adapt_swap((REF_GRID)all_done_local);
              if (uVar1 == 0) {
                uVar1 = ref_gather_tec_movie_frame((REF_GRID)all_done_local,"swap");
                if (uVar1 == 0) {
                  if (1 < *(int *)(*(long *)(all_done_local + 0x2a) + 0x7c)) {
                    ref_mpi_stopwatch_stop(*(REF_MPI *)all_done_local,"adapt swap");
                  }
                  if ((*(int *)(*(long *)(all_done_local + 0x2a) + 0x80) == 0) ||
                     (uVar1 = ref_adapt_tattle((REF_GRID)all_done_local,"swap"), uVar1 == 0)) {
                    if ((*(int *)(*(long *)(all_done_local + 0x2a) + 0x84) == 0) ||
                       (uVar1 = ref_adapt_topo((REF_GRID)all_done_local), uVar1 == 0)) {
                      uVar1 = ref_collapse_pass((REF_GRID)all_done_local);
                      if (uVar1 == 0) {
                        uVar1 = ref_gather_tec_movie_frame((REF_GRID)all_done_local,"collapse");
                        if (uVar1 == 0) {
                          if (1 < *(int *)(*(long *)(all_done_local + 0x2a) + 0x7c)) {
                            ref_mpi_stopwatch_stop(*(REF_MPI *)all_done_local,"adapt col");
                          }
                          if ((*(int *)(*(long *)(all_done_local + 0x2a) + 0x80) == 0) ||
                             (uVar1 = ref_adapt_tattle((REF_GRID)all_done_local,"col"), uVar1 == 0))
                          {
                            if ((*(int *)(*(long *)(all_done_local + 0x2a) + 0x84) == 0) ||
                               (uVar1 = ref_adapt_topo((REF_GRID)all_done_local), uVar1 == 0)) {
                              uVar1 = ref_adapt_swap((REF_GRID)all_done_local);
                              if (uVar1 == 0) {
                                uVar1 = ref_gather_tec_movie_frame((REF_GRID)all_done_local,"swap");
                                if (uVar1 == 0) {
                                  if (1 < *(int *)(*(long *)(all_done_local + 0x2a) + 0x7c)) {
                                    ref_mpi_stopwatch_stop(*(REF_MPI *)all_done_local,"adapt swap");
                                  }
                                  if ((*(int *)(*(long *)(all_done_local + 0x2a) + 0x80) == 0) ||
                                     (uVar1 = ref_adapt_tattle((REF_GRID)all_done_local,"swap"),
                                     uVar1 == 0)) {
                                    if ((*(int *)(*(long *)(all_done_local + 0x2a) + 0x84) == 0) ||
                                       (uVar1 = ref_adapt_topo((REF_GRID)all_done_local), uVar1 == 0
                                       )) {
                                      dVar2 = sqrt(2.0);
                                      *(double *)(*(long *)(all_done_local + 0x2a) + 0x60) = dVar2;
                                      uVar1 = ref_collapse_pass((REF_GRID)all_done_local);
                                      if (uVar1 == 0) {
                                        uVar1 = ref_gather_tec_movie_frame
                                                          ((REF_GRID)all_done_local,"collapse");
                                        if (uVar1 == 0) {
                                          if (1 < *(int *)(*(long *)(all_done_local + 0x2a) + 0x7c))
                                          {
                                            ref_mpi_stopwatch_stop
                                                      (*(REF_MPI *)all_done_local,"adapt col");
                                          }
                                          if ((*(int *)(*(long *)(all_done_local + 0x2a) + 0x80) ==
                                               0) || (uVar1 = ref_adapt_tattle((REF_GRID)
                                                                               all_done_local,"col")
                                                     , uVar1 == 0)) {
                                            if ((*(int *)(*(long *)(all_done_local + 0x2a) + 0x84)
                                                 == 0) ||
                                               (uVar1 = ref_adapt_topo((REF_GRID)all_done_local),
                                               uVar1 == 0)) {
                                              *(undefined8 *)
                                               (*(long *)(all_done_local + 0x2a) + 0x60) =
                                                   *(undefined8 *)
                                                    (*(long *)(all_done_local + 0x2a) + 0x70);
                                              for (ref_private_macro_code_rss = 0;
                                                  ref_private_macro_code_rss < 1;
                                                  ref_private_macro_code_rss =
                                                       ref_private_macro_code_rss + 1) {
                                                uVar1 = ref_adapt_swap((REF_GRID)all_done_local);
                                                if (uVar1 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2aa,"ref_adapt_pass",(ulong)uVar1,"swap pass");
                                                  return uVar1;
                                                }
                                                uVar1 = ref_gather_tec_movie_frame
                                                                  ((REF_GRID)all_done_local,"swap");
                                                if (uVar1 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2ab,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  return uVar1;
                                                }
                                                if (1 < *(int *)(*(long *)(all_done_local + 0x2a) +
                                                                0x7c)) {
                                                  ref_mpi_stopwatch_stop
                                                            (*(REF_MPI *)all_done_local,"adapt swap"
                                                            );
                                                }
                                                if ((*(int *)(*(long *)(all_done_local + 0x2a) +
                                                             0x80) != 0) &&
                                                   (uVar1 = ref_adapt_tattle((REF_GRID)
                                                                             all_done_local,"swap"),
                                                   uVar1 != 0)) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2af,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  return uVar1;
                                                }
                                                if ((*(int *)(*(long *)(all_done_local + 0x2a) +
                                                             0x84) != 0) &&
                                                   (uVar1 = ref_adapt_topo((REF_GRID)all_done_local)
                                                   , uVar1 != 0)) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2b1,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  return uVar1;
                                                }
                                                uVar1 = ref_smooth_pass((REF_GRID)all_done_local);
                                                if (uVar1 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2b3,"ref_adapt_pass",(ulong)uVar1,"smooth pass"
                                                  );
                                                  return uVar1;
                                                }
                                                uVar1 = ref_gather_tec_movie_frame
                                                                  ((REF_GRID)all_done_local,"smooth"
                                                                  );
                                                if (uVar1 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2b4,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  return uVar1;
                                                }
                                                if (1 < *(int *)(*(long *)(all_done_local + 0x2a) +
                                                                0x7c)) {
                                                  ref_mpi_stopwatch_stop
                                                            (*(REF_MPI *)all_done_local,"adapt move"
                                                            );
                                                }
                                                if ((*(int *)(*(long *)(all_done_local + 0x2a) +
                                                             0x80) != 0) &&
                                                   (uVar1 = ref_adapt_tattle((REF_GRID)
                                                                             all_done_local,"move"),
                                                   uVar1 != 0)) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2b8,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  return uVar1;
                                                }
                                                if ((*(int *)(*(long *)(all_done_local + 0x2a) +
                                                             0x84) != 0) &&
                                                   (uVar1 = ref_adapt_topo((REF_GRID)all_done_local)
                                                   , uVar1 != 0)) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2ba,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  return uVar1;
                                                }
                                              }
                                              uVar1 = ref_adapt_swap((REF_GRID)all_done_local);
                                              if (uVar1 == 0) {
                                                uVar1 = ref_gather_tec_movie_frame
                                                                  ((REF_GRID)all_done_local,"swap");
                                                if (uVar1 == 0) {
                                                  if (1 < *(int *)(*(long *)(all_done_local + 0x2a)
                                                                  + 0x7c)) {
                                                    ref_mpi_stopwatch_stop
                                                              (*(REF_MPI *)all_done_local,
                                                               "adapt swap");
                                                  }
                                                  if ((*(int *)(*(long *)(all_done_local + 0x2a) +
                                                               0x80) == 0) ||
                                                     (uVar1 = ref_adapt_tattle((REF_GRID)
                                                                               all_done_local,"swap"
                                                                              ), uVar1 == 0)) {
                                                    if ((*(int *)(*(long *)(all_done_local + 0x2a) +
                                                                 0x84) == 0) ||
                                                       (uVar1 = ref_adapt_topo((REF_GRID)
                                                                               all_done_local),
                                                       uVar1 == 0)) {
                                                      uVar1 = ref_adapt_parameter((REF_GRID)
                                                                                  all_done_local,
                                                                                  &
                                                  swap_smooth_passes);
                                                  if (uVar1 == 0) {
                                                    uVar1 = ref_split_pass((REF_GRID)all_done_local)
                                                    ;
                                                    if (uVar1 == 0) {
                                                      uVar1 = ref_gather_tec_movie_frame
                                                                        ((REF_GRID)all_done_local,
                                                                         "split");
                                                      if (uVar1 == 0) {
                                                        if (1 < *(int *)(*(long *)(all_done_local +
                                                                                  0x2a) + 0x7c)) {
                                                          ref_mpi_stopwatch_stop
                                                                    (*(REF_MPI *)all_done_local,
                                                                     "adapt spl");
                                                        }
                                                        if ((*(int *)(*(long *)(all_done_local +
                                                                               0x2a) + 0x80) == 0)
                                                           || (uVar1 = ref_adapt_tattle((REF_GRID)
                                                                                                                                                                                
                                                  all_done_local,"split"), uVar1 == 0)) {
                                                    if ((*(int *)(*(long *)(all_done_local + 0x2a) +
                                                                 0x84) == 0) ||
                                                       (uVar1 = ref_adapt_topo((REF_GRID)
                                                                               all_done_local),
                                                       uVar1 == 0)) {
                                                      uVar1 = ref_adapt_swap((REF_GRID)
                                                                             all_done_local);
                                                      if (uVar1 == 0) {
                                                        uVar1 = ref_gather_tec_movie_frame
                                                                          ((REF_GRID)all_done_local,
                                                                           "swap");
                                                        if (uVar1 == 0) {
                                                          if (1 < *(int *)(*(long *)(all_done_local
                                                                                    + 0x2a) + 0x7c))
                                                          {
                                                            ref_mpi_stopwatch_stop
                                                                      (*(REF_MPI *)all_done_local,
                                                                       "adapt swap");
                                                          }
                                                          if ((*(int *)(*(long *)(all_done_local +
                                                                                 0x2a) + 0x80) == 0)
                                                             || (uVar1 = ref_adapt_tattle((REF_GRID)
                                                                                                                                                                                    
                                                  all_done_local,"swap"), uVar1 == 0)) {
                                                    if ((*(int *)(*(long *)(all_done_local + 0x2a) +
                                                                 0x84) == 0) ||
                                                       (uVar1 = ref_adapt_topo((REF_GRID)
                                                                               all_done_local),
                                                       uVar1 == 0)) {
                                                      for (ref_private_macro_code_rss = 0;
                                                          ref_private_macro_code_rss < 1;
                                                          ref_private_macro_code_rss =
                                                               ref_private_macro_code_rss + 1) {
                                                        uVar1 = ref_smooth_pass((REF_GRID)
                                                                                all_done_local);
                                                        if (uVar1 != 0) {
                                                          printf("%s: %d: %s: %d %s\n",
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2db,"ref_adapt_pass",(ulong)uVar1,"smooth pass"
                                                  );
                                                  return uVar1;
                                                  }
                                                  uVar1 = ref_gather_tec_movie_frame
                                                                    ((REF_GRID)all_done_local,
                                                                     "smooth");
                                                  if (uVar1 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2dc,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  return uVar1;
                                                  }
                                                  if (1 < *(int *)(*(long *)(all_done_local + 0x2a)
                                                                  + 0x7c)) {
                                                    ref_mpi_stopwatch_stop
                                                              (*(REF_MPI *)all_done_local,
                                                               "adapt move");
                                                  }
                                                  if ((*(int *)(*(long *)(all_done_local + 0x2a) +
                                                               0x80) != 0) &&
                                                     (uVar1 = ref_adapt_tattle((REF_GRID)
                                                                               all_done_local,"move"
                                                                              ), uVar1 != 0)) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2e0,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  return uVar1;
                                                  }
                                                  if ((*(int *)(*(long *)(all_done_local + 0x2a) +
                                                               0x84) != 0) &&
                                                     (uVar1 = ref_adapt_topo((REF_GRID)
                                                                             all_done_local),
                                                     uVar1 != 0)) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2e2,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  return uVar1;
                                                  }
                                                  uVar1 = ref_adapt_swap((REF_GRID)all_done_local);
                                                  if (uVar1 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2e4,"ref_adapt_pass",(ulong)uVar1,"swap pass");
                                                  return uVar1;
                                                  }
                                                  uVar1 = ref_gather_tec_movie_frame
                                                                    ((REF_GRID)all_done_local,"swap"
                                                                    );
                                                  if (uVar1 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2e5,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  return uVar1;
                                                  }
                                                  if (1 < *(int *)(*(long *)(all_done_local + 0x2a)
                                                                  + 0x7c)) {
                                                    ref_mpi_stopwatch_stop
                                                              (*(REF_MPI *)all_done_local,
                                                               "adapt swap");
                                                  }
                                                  if ((*(int *)(*(long *)(all_done_local + 0x2a) +
                                                               0x80) != 0) &&
                                                     (uVar1 = ref_adapt_tattle((REF_GRID)
                                                                               all_done_local,"swap"
                                                                              ), uVar1 != 0)) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2e9,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  return uVar1;
                                                  }
                                                  if ((*(int *)(*(long *)(all_done_local + 0x2a) +
                                                               0x84) != 0) &&
                                                     (uVar1 = ref_adapt_topo((REF_GRID)
                                                                             all_done_local),
                                                     uVar1 != 0)) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2eb,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  return uVar1;
                                                  }
                                                  }
                                                  dVar2 = sqrt(2.0);
                                                  *(double *)
                                                   (*(long *)(all_done_local + 0x2a) + 0x60) = dVar2
                                                  ;
                                                  uVar1 = ref_collapse_pass((REF_GRID)all_done_local
                                                                           );
                                                  if (uVar1 == 0) {
                                                    uVar1 = ref_gather_tec_movie_frame
                                                                      ((REF_GRID)all_done_local,
                                                                       "collapse");
                                                    if (uVar1 == 0) {
                                                      if (1 < *(int *)(*(long *)(all_done_local +
                                                                                0x2a) + 0x7c)) {
                                                        ref_mpi_stopwatch_stop
                                                                  (*(REF_MPI *)all_done_local,
                                                                   "adapt col");
                                                      }
                                                      if ((*(int *)(*(long *)(all_done_local + 0x2a)
                                                                   + 0x80) == 0) ||
                                                         (uVar1 = ref_adapt_tattle((REF_GRID)
                                                                                   all_done_local,
                                                                                   "col"),
                                                         uVar1 == 0)) {
                                                        if ((*(int *)(*(long *)(all_done_local +
                                                                               0x2a) + 0x84) == 0)
                                                           || (uVar1 = ref_adapt_topo((REF_GRID)
                                                                                      all_done_local
                                                                                     ), uVar1 == 0))
                                                        {
                                                          *(undefined8 *)
                                                           (*(long *)(all_done_local + 0x2a) + 0x60)
                                                               = *(undefined8 *)
                                                                  (*(long *)(all_done_local + 0x2a)
                                                                  + 0x70);
                                                          uVar1 = ref_adapt_swap((REF_GRID)
                                                                                 all_done_local);
                                                          if (uVar1 == 0) {
                                                            uVar1 = ref_gather_tec_movie_frame
                                                                              ((REF_GRID)
                                                                               all_done_local,"swap"
                                                                              );
                                                            if (uVar1 == 0) {
                                                              if (1 < *(int *)(*(long *)(
                                                  all_done_local + 0x2a) + 0x7c)) {
                                                    ref_mpi_stopwatch_stop
                                                              (*(REF_MPI *)all_done_local,
                                                               "adapt swap");
                                                  }
                                                  if ((*(int *)(*(long *)(all_done_local + 0x2a) +
                                                               0x80) == 0) ||
                                                     (uVar1 = ref_adapt_tattle((REF_GRID)
                                                                               all_done_local,"swap"
                                                                              ), uVar1 == 0)) {
                                                    if ((*(int *)(*(long *)(all_done_local + 0x2a) +
                                                                 0x84) == 0) ||
                                                       (uVar1 = ref_adapt_topo((REF_GRID)
                                                                               all_done_local),
                                                       uVar1 == 0)) {
                                                      for (ref_private_macro_code_rss = 0;
                                                          ref_private_macro_code_rss < 1;
                                                          ref_private_macro_code_rss =
                                                               ref_private_macro_code_rss + 1) {
                                                        uVar1 = ref_smooth_pass((REF_GRID)
                                                                                all_done_local);
                                                        if (uVar1 != 0) {
                                                          printf("%s: %d: %s: %d %s\n",
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x306,"ref_adapt_pass",(ulong)uVar1,"smooth pass"
                                                  );
                                                  return uVar1;
                                                  }
                                                  uVar1 = ref_gather_tec_movie_frame
                                                                    ((REF_GRID)all_done_local,
                                                                     "smooth");
                                                  if (uVar1 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x307,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  return uVar1;
                                                  }
                                                  if (1 < *(int *)(*(long *)(all_done_local + 0x2a)
                                                                  + 0x7c)) {
                                                    ref_mpi_stopwatch_stop
                                                              (*(REF_MPI *)all_done_local,
                                                               "adapt move");
                                                  }
                                                  if ((*(int *)(*(long *)(all_done_local + 0x2a) +
                                                               0x80) != 0) &&
                                                     (uVar1 = ref_adapt_tattle((REF_GRID)
                                                                               all_done_local,"move"
                                                                              ), uVar1 != 0)) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x30b,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  return uVar1;
                                                  }
                                                  if ((*(int *)(*(long *)(all_done_local + 0x2a) +
                                                               0x84) != 0) &&
                                                     (uVar1 = ref_adapt_topo((REF_GRID)
                                                                             all_done_local),
                                                     uVar1 != 0)) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x30d,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  return uVar1;
                                                  }
                                                  uVar1 = ref_adapt_swap((REF_GRID)all_done_local);
                                                  if (uVar1 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x30f,"ref_adapt_pass",(ulong)uVar1,"swap pass");
                                                  return uVar1;
                                                  }
                                                  uVar1 = ref_gather_tec_movie_frame
                                                                    ((REF_GRID)all_done_local,"swap"
                                                                    );
                                                  if (uVar1 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x310,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  return uVar1;
                                                  }
                                                  if (1 < *(int *)(*(long *)(all_done_local + 0x2a)
                                                                  + 0x7c)) {
                                                    ref_mpi_stopwatch_stop
                                                              (*(REF_MPI *)all_done_local,
                                                               "adapt swap");
                                                  }
                                                  if ((*(int *)(*(long *)(all_done_local + 0x2a) +
                                                               0x80) != 0) &&
                                                     (uVar1 = ref_adapt_tattle((REF_GRID)
                                                                               all_done_local,"swap"
                                                                              ), uVar1 != 0)) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x314,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  return uVar1;
                                                  }
                                                  if ((*(int *)(*(long *)(all_done_local + 0x2a) +
                                                               0x84) != 0) &&
                                                     (uVar1 = ref_adapt_topo((REF_GRID)
                                                                             all_done_local),
                                                     uVar1 != 0)) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x316,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  return uVar1;
                                                  }
                                                  }
                                                  if (*(int *)(*(long *)(all_done_local + 0x2a) +
                                                              0x78) != 0) {
                                                    uVar1 = ref_split_edge_geometry
                                                                      ((REF_GRID)all_done_local);
                                                    if (uVar1 != 0) {
                                                      printf("%s: %d: %s: %d %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x31a,"ref_adapt_pass",(ulong)uVar1,
                                                  "split edge geom");
                                                  return uVar1;
                                                  }
                                                  if (1 < *(int *)(*(long *)(all_done_local + 0x2a)
                                                                  + 0x7c)) {
                                                    ref_mpi_stopwatch_stop
                                                              (*(REF_MPI *)all_done_local,
                                                               "adapt unlock");
                                                  }
                                                  }
                                                  uVar1 = ref_adapt_tattle((REF_GRID)all_done_local,
                                                                           "adapt");
                                                  if (uVar1 == 0) {
                                                    if ((all_done1 < 1) ||
                                                       (ref_grid_local._4_4_ =
                                                             ref_geom_verify_topo
                                                                       ((REF_GRID)all_done_local),
                                                       ref_grid_local._4_4_ == 0)) {
                                                      local_14d = i != 0 && swap_smooth_passes != 0;
                                                      *_all_done0 = (uint)local_14d;
                                                      ref_grid_local._4_4_ = 0;
                                                    }
                                                    else {
                                                      printf("%s: %d: %s: %d %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x322,"ref_adapt_pass",
                                                  (ulong)ref_grid_local._4_4_,
                                                  "geom topo postflight check");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,799,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x303,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x301,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2fd,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2fc,"ref_adapt_pass",(ulong)uVar1,"swap pass");
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2f7,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2f5,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2f1,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2f0,"ref_adapt_pass",(ulong)uVar1,"col pass");
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2d8,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2d6,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2d2,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2d1,"ref_adapt_pass",(ulong)uVar1,"swap pass");
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2cf,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2cd,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2c9,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2c8,"ref_adapt_pass",(ulong)uVar1,
                                                  "split surfpass");
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2c6,"ref_adapt_pass",(ulong)uVar1,"param");
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2c4,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2c2,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  ref_grid_local._4_4_ = uVar1;
                                                  }
                                                }
                                                else {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2be,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  ref_grid_local._4_4_ = uVar1;
                                                }
                                              }
                                              else {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2bd,"ref_adapt_pass",(ulong)uVar1,"swap pass");
                                                ref_grid_local._4_4_ = uVar1;
                                              }
                                            }
                                            else {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2a4,"ref_adapt_pass",(ulong)uVar1,"topo");
                                              ref_grid_local._4_4_ = uVar1;
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2a2,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                            ref_grid_local._4_4_ = uVar1;
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                 ,0x29e,"ref_adapt_pass",(ulong)uVar1,"movie frame")
                                          ;
                                          ref_grid_local._4_4_ = uVar1;
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                               ,0x29d,"ref_adapt_pass",(ulong)uVar1,"col pass");
                                        ref_grid_local._4_4_ = uVar1;
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                             ,0x299,"ref_adapt_pass",(ulong)uVar1,"topo");
                                      ref_grid_local._4_4_ = uVar1;
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                           ,0x297,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                    ref_grid_local._4_4_ = uVar1;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                         ,0x293,"ref_adapt_pass",(ulong)uVar1,"movie frame");
                                  ref_grid_local._4_4_ = uVar1;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                       ,0x292,"ref_adapt_pass",(ulong)uVar1,"swap pass");
                                ref_grid_local._4_4_ = uVar1;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                     ,0x290,"ref_adapt_pass",(ulong)uVar1,"topo");
                              ref_grid_local._4_4_ = uVar1;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                   ,0x28e,"ref_adapt_pass",(ulong)uVar1,"tattle");
                            ref_grid_local._4_4_ = uVar1;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                 ,0x28a,"ref_adapt_pass",(ulong)uVar1,"movie frame");
                          ref_grid_local._4_4_ = uVar1;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                               ,0x289,"ref_adapt_pass",(ulong)uVar1,"col pass");
                        ref_grid_local._4_4_ = uVar1;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                             ,0x287,"ref_adapt_pass",(ulong)uVar1,"topo");
                      ref_grid_local._4_4_ = uVar1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                           ,0x285,"ref_adapt_pass",(ulong)uVar1,"tattle");
                    ref_grid_local._4_4_ = uVar1;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                         ,0x281,"ref_adapt_pass",(ulong)uVar1,"movie frame");
                  ref_grid_local._4_4_ = uVar1;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                       ,0x280,"ref_adapt_pass",(ulong)uVar1,"swap pass");
                ref_grid_local._4_4_ = uVar1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                     ,0x27e,"ref_adapt_pass",(ulong)uVar1,"topo");
              ref_grid_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,0x27c,"ref_adapt_pass",(ulong)uVar1,"tattle");
            ref_grid_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x278,"ref_adapt_pass",(ulong)uVar1,"movie frame");
          ref_grid_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x276,"ref_adapt_pass",(ulong)uVar1,"adapt preflight check");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x275
             ,"ref_adapt_pass",(ulong)uVar1,"count ngeom");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x271,
           "ref_adapt_pass",(ulong)uVar1,"param");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_adapt_pass(REF_GRID ref_grid, REF_BOOL *all_done) {
  REF_INT ngeom;
  REF_BOOL all_done0, all_done1;
  REF_INT i, swap_smooth_passes = 1;

  RSS(ref_adapt_parameter(ref_grid, &all_done0), "param");

  RSS(ref_gather_ngeom(ref_grid_node(ref_grid), ref_grid_geom(ref_grid),
                       REF_GEOM_FACE, &ngeom),
      "count ngeom");
  if (ngeom > 0) RSS(ref_geom_verify_topo(ref_grid), "adapt preflight check");

  ref_gather_blocking_frame(ref_grid, "threed pass");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt start");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "start"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  RSS(ref_adapt_swap(ref_grid), "swap pass");
  ref_gather_blocking_frame(ref_grid, "swap");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  RSS(ref_collapse_pass(ref_grid), "col pass");
  ref_gather_blocking_frame(ref_grid, "collapse");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt col");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "col"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  RSS(ref_adapt_swap(ref_grid), "swap pass");
  ref_gather_blocking_frame(ref_grid, "swap");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  ref_grid_adapt(ref_grid, post_max_ratio) = sqrt(2.0);

  RSS(ref_collapse_pass(ref_grid), "col pass");
  ref_gather_blocking_frame(ref_grid, "collapse");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt col");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "col"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  ref_grid_adapt(ref_grid, post_max_ratio) =
      ref_grid_adapt(ref_grid, last_max_ratio);

  for (i = 0; i < swap_smooth_passes; i++) {
    RSS(ref_adapt_swap(ref_grid), "swap pass");
    ref_gather_blocking_frame(ref_grid, "swap");
    if (ref_grid_adapt(ref_grid, timing_level) > 1)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
    if (ref_grid_adapt(ref_grid, watch_param))
      RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSS(ref_adapt_topo(ref_grid), "topo");

    RSS(ref_smooth_pass(ref_grid), "smooth pass");
    ref_gather_blocking_frame(ref_grid, "smooth");
    if (ref_grid_adapt(ref_grid, timing_level > 1))
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt move");
    if (ref_grid_adapt(ref_grid, watch_param))
      RSS(ref_adapt_tattle(ref_grid, "move"), "tattle");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSS(ref_adapt_topo(ref_grid), "topo");
  }

  RSS(ref_adapt_swap(ref_grid), "swap pass");
  ref_gather_blocking_frame(ref_grid, "swap");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  RSS(ref_adapt_parameter(ref_grid, &all_done1), "param");

  RSS(ref_split_pass(ref_grid), "split surfpass");
  ref_gather_blocking_frame(ref_grid, "split");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt spl");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "split"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  RSS(ref_adapt_swap(ref_grid), "swap pass");
  ref_gather_blocking_frame(ref_grid, "swap");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  for (i = 0; i < swap_smooth_passes; i++) {
    RSS(ref_smooth_pass(ref_grid), "smooth pass");
    ref_gather_blocking_frame(ref_grid, "smooth");
    if (ref_grid_adapt(ref_grid, timing_level) > 1)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt move");
    if (ref_grid_adapt(ref_grid, watch_param))
      RSS(ref_adapt_tattle(ref_grid, "move"), "tattle");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSS(ref_adapt_topo(ref_grid), "topo");

    RSS(ref_adapt_swap(ref_grid), "swap pass");
    ref_gather_blocking_frame(ref_grid, "swap");
    if (ref_grid_adapt(ref_grid, timing_level) > 1)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
    if (ref_grid_adapt(ref_grid, watch_param))
      RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSS(ref_adapt_topo(ref_grid), "topo");
  }

  ref_grid_adapt(ref_grid, post_max_ratio) = sqrt(2.0);

  RSS(ref_collapse_pass(ref_grid), "col pass");
  ref_gather_blocking_frame(ref_grid, "collapse");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt col");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "col"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  ref_grid_adapt(ref_grid, post_max_ratio) =
      ref_grid_adapt(ref_grid, last_max_ratio);

  RSS(ref_adapt_swap(ref_grid), "swap pass");
  ref_gather_blocking_frame(ref_grid, "swap");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  for (i = 0; i < swap_smooth_passes; i++) {
    RSS(ref_smooth_pass(ref_grid), "smooth pass");
    ref_gather_blocking_frame(ref_grid, "smooth");
    if (ref_grid_adapt(ref_grid, timing_level) > 1)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt move");
    if (ref_grid_adapt(ref_grid, watch_param))
      RSS(ref_adapt_tattle(ref_grid, "move"), "tattle");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSS(ref_adapt_topo(ref_grid), "topo");

    RSS(ref_adapt_swap(ref_grid), "swap pass");
    ref_gather_blocking_frame(ref_grid, "swap");
    if (ref_grid_adapt(ref_grid, timing_level) > 1)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
    if (ref_grid_adapt(ref_grid, watch_param))
      RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSS(ref_adapt_topo(ref_grid), "topo");
  }

  if (ref_grid_adapt(ref_grid, unlock_tet)) {
    RSS(ref_split_edge_geometry(ref_grid), "split edge geom");
    if (ref_grid_adapt(ref_grid, timing_level) > 1)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt unlock");
  }

  RSS(ref_adapt_tattle(ref_grid, "adapt"), "tattle");

  if (ngeom > 0)
    RSS(ref_geom_verify_topo(ref_grid), "geom topo postflight check");

  *all_done = (all_done0 && all_done1);

  return REF_SUCCESS;
}